

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_mediator.hpp
# Opt level: O2

bool __thiscall iutest::TestInfo::Mediator::HasFatalFailure(Mediator *this)

{
  bool bVar1;
  
  bVar1 = TestResult::HasFatalFailure
                    (&((this->super_iuITestInfoMediator).m_test_info)->m_test_result);
  return bVar1;
}

Assistant:

TestInfo* ptr() const IUTEST_CXX_NOEXCEPT_SPEC { return m_test_info; }